

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char ** bc_str_split(char *str,char c,size_t max_pieces)

{
  char cVar1;
  void *ptr;
  size_t sVar2;
  void *__dest;
  char **ppcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (str == (char *)0x0) {
    ppcVar3 = (char **)0x0;
  }
  else {
    ptr = bc_malloc(8);
    sVar2 = strlen(str);
    if (sVar2 == 0xffffffffffffffff) {
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      lVar4 = 0;
      uVar5 = 0;
      do {
        if (*str == '\0') break;
        cVar1 = str[uVar5];
        if (cVar1 == c) {
          if (cVar1 == '\0' || lVar6 + 1U <= max_pieces - 1) {
LAB_00109901:
            ptr = bc_realloc(ptr,lVar6 * 8 + 8);
            __dest = bc_malloc((uVar5 - lVar4) + 1);
            *(void **)((long)ptr + lVar6 * 8) = __dest;
            memcpy(__dest,str + lVar4,uVar5 - lVar4);
            *(undefined1 *)((long)__dest + (uVar5 - lVar4)) = 0;
            lVar4 = uVar5 + 1;
            lVar6 = lVar6 + 1;
          }
        }
        else if (cVar1 == '\0') goto LAB_00109901;
        uVar5 = uVar5 + 1;
        sVar2 = strlen(str);
      } while (uVar5 < sVar2 + 1);
    }
    ppcVar3 = (char **)bc_realloc(ptr,lVar6 * 8 + 8);
    ppcVar3[lVar6] = (char *)0x0;
  }
  return ppcVar3;
}

Assistant:

char**
bc_str_split(const char *str, char c, size_t max_pieces)
{
    if (str == NULL)
        return NULL;
    char **rv = bc_malloc(sizeof(char*));
    size_t i, start = 0, count = 0;
    for (i = 0; i < strlen(str) + 1; i++) {
        if (str[0] == '\0')
            break;
        if ((str[i] == c && (!max_pieces || count + 1 < max_pieces)) || str[i] == '\0') {
            rv = bc_realloc(rv, (count + 1) * sizeof(char*));
            rv[count] = bc_malloc(i - start + 1);
            memcpy(rv[count], str + start, i - start);
            rv[count++][i - start] = '\0';
            start = i + 1;
        }
    }
    rv = bc_realloc(rv, (count + 1) * sizeof(char*));
    rv[count] = NULL;
    return rv;
}